

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plycmd.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ostream *poVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined1 auVar9 [12];
  exception *ex;
  Model *model;
  PLYReader ply;
  string p;
  double ext_height;
  double ext_scale;
  string bout;
  string aout;
  float scale;
  bool all;
  bool merge;
  string spath;
  string name;
  Parameter param;
  char *def [29];
  char *in_stack_fffffffffffffa98;
  Parameter *in_stack_fffffffffffffaa0;
  PLYReader *in_stack_fffffffffffffab0;
  Parameter *in_stack_fffffffffffffac0;
  Model *pMVar10;
  ostream *in_stack_fffffffffffffb18;
  undefined2 uVar11;
  undefined5 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb25;
  undefined1 in_stack_fffffffffffffb26;
  undefined1 in_stack_fffffffffffffb27;
  ostream *in_stack_fffffffffffffb28;
  PLYReader *in_stack_fffffffffffffb30;
  undefined6 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3e;
  undefined1 in_stack_fffffffffffffb3f;
  string *in_stack_fffffffffffffb40;
  string *p_00;
  Parameter *in_stack_fffffffffffffb60;
  Model *local_498;
  size_t in_stack_fffffffffffffbb0;
  ostream *in_stack_fffffffffffffbb8;
  Parameter *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  Parameter *in_stack_fffffffffffffc30;
  double *in_stack_fffffffffffffc88;
  Parameter *in_stack_fffffffffffffc90;
  string local_250 [32];
  double local_230;
  double local_228;
  string local_220 [32];
  char *in_stack_fffffffffffffe00;
  char **in_stack_fffffffffffffe08;
  char **in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  float fVar12;
  undefined2 in_stack_fffffffffffffe24;
  undefined1 in_stack_fffffffffffffe26;
  byte bVar13;
  undefined1 in_stack_fffffffffffffe27;
  string local_1d8 [32];
  string local_1b8 [32];
  int local_198;
  string local_f8 [244];
  int local_4;
  
  local_4 = 0;
  p_00 = local_f8;
  memcpy(p_00,&PTR_anon_var_dwarf_1c5a_001f8380,0xe8);
  gutil::Parameter::Parameter
            ((Parameter *)
             CONCAT17(in_stack_fffffffffffffe27,
                      CONCAT16(in_stack_fffffffffffffe26,
                               CONCAT24(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20))),
             in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe00);
  iVar2 = gutil::Parameter::remaining(in_stack_fffffffffffffaa0);
  if (iVar2 < 1) {
    gutil::Parameter::printHelp
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    local_4 = 10;
    local_198 = 1;
  }
  else {
    std::__cxx11::string::string(local_1b8);
    std::__cxx11::string::string(local_1d8);
    bVar13 = 1;
    fVar12 = 1.0;
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe00);
    std::__cxx11::string::string(local_220);
    local_228 = 0.0;
    local_230 = 0.0;
    pcVar4 = getenv("CVKIT_SPATH");
    if (pcVar4 != (char *)0x0) {
      pcVar4 = getenv("CVKIT_SPATH");
      std::__cxx11::string::operator=(local_1d8,pcVar4);
    }
    bVar1 = gutil::Parameter::isNextParameter(in_stack_fffffffffffffac0);
    if (!bVar1) {
      gutil::Parameter::nextString
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    }
    do {
      iVar2 = gutil::Parameter::remaining(in_stack_fffffffffffffaa0);
      uVar11 = (undefined2)((ulong)in_stack_fffffffffffffb18 >> 0x30);
      if (iVar2 < 1) {
        lVar6 = std::__cxx11::string::size();
        if ((lVar6 != 0) || (lVar6 = std::__cxx11::string::size(), lVar6 != 0)) {
          lVar6 = std::__cxx11::string::size();
          if (lVar6 == 0) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"No input file given!");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            local_4 = 10;
            local_198 = 1;
            break;
          }
          if ((local_228 <= 0.0) || (local_230 <= 0.0)) {
            std::__cxx11::string::c_str();
            std::__cxx11::string::c_str();
            local_498 = gvr::loadModel((char *)in_stack_fffffffffffffb28,
                                       (char *)CONCAT17(in_stack_fffffffffffffb27,
                                                        CONCAT16(in_stack_fffffffffffffb26,
                                                                 CONCAT15(in_stack_fffffffffffffb25,
                                                                          in_stack_fffffffffffffb20)
                                                                )),SUB21((ushort)uVar11 >> 8,0),
                                       SUB21(uVar11,0));
          }
          else {
            std::__cxx11::string::c_str();
            local_498 = gvr::createModelFromContours
                                  ((char *)in_stack_fffffffffffffb40,
                                   (double)CONCAT17(in_stack_fffffffffffffb3f,
                                                    CONCAT16(in_stack_fffffffffffffb3e,
                                                             in_stack_fffffffffffffb38)),
                                   (double)in_stack_fffffffffffffb30);
          }
          if ((fVar12 != 1.0) || (NAN(fVar12))) {
            (*local_498->_vptr_Model[2])((ulong)(uint)fVar12);
          }
          lVar6 = std::__cxx11::string::size();
          if (lVar6 != 0) {
            uVar7 = std::__cxx11::string::c_str();
            (*local_498->_vptr_Model[7])(local_498,uVar7,(ulong)(bVar13 & 1),0);
          }
          lVar6 = std::__cxx11::string::size();
          if (lVar6 != 0) {
            uVar8 = std::__cxx11::string::size();
            if (uVar8 < 5) {
LAB_00142e43:
              uVar7 = std::__cxx11::string::c_str();
              (*local_498->_vptr_Model[7])(local_498,uVar7,(ulong)(bVar13 & 1),1);
            }
            else {
              lVar6 = std::__cxx11::string::size();
              iVar2 = std::__cxx11::string::compare((ulong)local_220,lVar6 - 4,(char *)0x4);
              if (iVar2 != 0) {
                lVar6 = std::__cxx11::string::size();
                iVar2 = std::__cxx11::string::compare((ulong)local_220,lVar6 - 4,(char *)0x4);
                if (iVar2 != 0) goto LAB_00142e43;
              }
              pMVar10 = local_498;
              uVar7 = std::__cxx11::string::c_str();
              (*pMVar10->_vptr_Model[8])(pMVar10,uVar7);
            }
          }
          if (local_498 != (Model *)0x0) {
            (*local_498->_vptr_Model[1])();
          }
        }
        local_198 = 0;
        break;
      }
      in_stack_fffffffffffffb40 = local_250;
      std::__cxx11::string::string(in_stack_fffffffffffffb40);
      gutil::Parameter::nextParameter(in_stack_fffffffffffffb60,p_00);
      in_stack_fffffffffffffb3f =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
      if ((bool)in_stack_fffffffffffffb3f) {
        gutil::Parameter::printHelp
                  (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
        local_4 = 0;
        local_198 = 1;
      }
      else {
        in_stack_fffffffffffffb3e =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
        if ((bool)in_stack_fffffffffffffb3e) {
          in_stack_fffffffffffffb30 =
               (PLYReader *)
               std::operator<<((ostream *)&std::cout,"This program is part of cvkit version ");
          in_stack_fffffffffffffb28 = std::operator<<((ostream *)in_stack_fffffffffffffb30,"2.6.17")
          ;
          std::ostream::operator<<(in_stack_fffffffffffffb28,std::endl<char,std::char_traits<char>>)
          ;
          local_4 = 0;
          local_198 = 1;
        }
        else {
          in_stack_fffffffffffffb27 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
          if ((bool)in_stack_fffffffffffffb27) {
            gutil::Parameter::nextString
                      (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20
                      );
          }
          in_stack_fffffffffffffb26 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
          if ((bool)in_stack_fffffffffffffb26) {
            gvr::PLYReader::PLYReader(in_stack_fffffffffffffab0);
            auVar9 = std::__cxx11::string::c_str();
            uVar3 = gvr::PLYReader::open
                              ((PLYReader *)&stack0xfffffffffffffb70,auVar9._0_8_,auVar9._8_4_);
            in_stack_fffffffffffffb25 = (undefined1)uVar3;
            if ((uVar3 & 1) == 0) {
              in_stack_fffffffffffffb18 = std::operator<<((ostream *)&std::cerr,"Not a ply file: ");
              poVar5 = std::operator<<(in_stack_fffffffffffffb18,local_1b8);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
            else {
              gvr::PLYReader::printHeader(in_stack_fffffffffffffb30);
            }
            gvr::PLYReader::~PLYReader(in_stack_fffffffffffffab0);
          }
          std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
          if (bVar1) {
            bVar13 = 0;
          }
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
          if (bVar1) {
            gutil::Parameter::nextValue<float>
                      (in_stack_fffffffffffffc90,(float *)in_stack_fffffffffffffc88);
          }
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
          if (bVar1) {
            gutil::Parameter::nextValue<double>(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88)
            ;
            gutil::Parameter::nextValue<double>(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88)
            ;
          }
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
          if (bVar1) {
            gutil::Parameter::nextString
                      (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20
                      );
          }
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
          if (bVar1) {
            gutil::Parameter::nextString
                      (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20
                      );
          }
          local_198 = 0;
        }
      }
      std::__cxx11::string::~string(local_250);
    } while (local_198 == 0);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::~string(local_1b8);
  }
  gutil::Parameter::~Parameter(in_stack_fffffffffffffaa0);
  if (local_198 == 0) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
  try
  {
    const char *def[]=
    {
      "# plycmd <file> [<options>]",
      "#",
      "# The input file may be given in ply or stl format or as depth file. In case of a depth file, optional parameters may be appended to the file name, separated by commas. Parameters are:",
      "#",
      "# p=<parameter file>",
      "# i=<image file>",
      "# ds=<s>",
      "# x=<x>,y=<y>,w=<w>,h=<h>",
      "# s=<max step>",
      "#",
      "# Options are:",
      "#",
      "-help # Print help and exit.",
      "-version # Print version and exit.",
      "-spath # Search path for finding parameter files or images that are associated with the depth image. Default is the content of the environment variable CVKIT_SPATH.",
      " <dir list> # List of directories.",
      "-header # Print header of ply file.",
      "-merge # Merge double vertices. This only applies to STL files. Loading can take much longer.",
      "-reduce # Removes all data that is unnecessary for visualization.",
      "-mul # Multiply the given factor to all vertices.",
      " <s> # Scaling factor.",
      "-extrusion # Creates a ply file from contours of a binary image. Pixel of the brightest color are foreground, all others are background.",
      " <scale> # Factor scaling the x/y pixel coordinates.",
      " <height> # Height of object.",
      "-ascii # Store in ascii ply format.",
      " <file> # Output file.",
      "-out # Store in binary ply or stl format (depending on suffix).",
      " <file> # Output file.",
      0
    };

    gutil::Parameter param(argc, argv, def);

    if (param.remaining() < 1)
    {
      param.printHelp(std::cout);
      return 10;
    }

    // handle options

    std::string name;
    std::string spath;
    bool   merge=false;
    bool   all=true;
    float scale=1.0f;
    std::string aout;
    std::string bout;
    double ext_scale=0;
    double ext_height=0;

    if (getenv("CVKIT_SPATH") != 0)
    {
      spath=getenv("CVKIT_SPATH");
    }

    if (!param.isNextParameter())
    {
      param.nextString(name);
    }

    while (param.remaining() > 0)
    {
      std::string p;

      param.nextParameter(p);

      if (p == "-help")
      {
        param.printHelp(std::cout);
        return 0;
      }

      if (p == "-version")
      {
        std::cout << "This program is part of cvkit version " << VERSION << std::endl;
        return 0;
      }

      if (p == "-spath")
      {
        param.nextString(spath);
      }

      if (p == "-header")
      {
        gvr::PLYReader ply;

        if (ply.open(name.c_str()))
        {
          ply.printHeader();
        }
        else
        {
          std::cerr << "Not a ply file: " << name << std::endl;
        }
      }

      if (p == "-merge")
      {
        merge=true;
      }

      if (p == "-reduce")
      {
        all=false;
      }

      if (p == "-mul")
      {
        param.nextValue(scale);
      }

      if (p == "-extrusion")
      {
        param.nextValue(ext_scale);
        param.nextValue(ext_height);
      }

      if (p == "-ascii")
      {
        param.nextString(aout);
      }

      if (p == "-out")
      {
        param.nextString(bout);
      }
    }

    if (aout.size() > 0 || bout.size() > 0)
    {
      if (name.size() > 0)
      {
        gvr::Model *model=0;

        if (ext_scale > 0 && ext_height > 0)
        {
          model=gvr::createModelFromContours(name.c_str(), ext_scale, ext_height);
        }
        else
        {
          model=gvr::loadModel(name.c_str(), spath.c_str(), true, merge);
        }

        if (scale != 1.0f)
        {
          model->scale(scale);
        }

        if (aout.size() > 0)
        {
          model->savePLY(aout.c_str(), all, gvr::ply_ascii);
        }

        if (bout.size() > 0)
        {
          if (bout.size() > 4 && (bout.compare(bout.size()-4, 4, ".stl") == 0 ||
            bout.compare(bout.size()-4, 4, ".STL") == 0))
          {
            model->saveSTL(bout.c_str());
          }
          else
          {
            model->savePLY(bout.c_str(), all, gvr::ply_binary);
          }
        }

        delete model;
      }
      else
      {
        std::cerr << "No input file given!" << std::endl;
        return 10;
      }
    }
  }
  catch (const std::exception &ex)
  {
    std::cerr << ex.what() << std::endl;
  }

  return 0;
}